

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cc
# Opt level: O0

Token __thiscall flow::lang::Lexer::continueParseIPv6(Lexer *this,bool firstComplete)

{
  int iVar1;
  size_t sVar2;
  char *__s;
  bool bVar3;
  bool local_62;
  allocator<char> local_41;
  string local_40;
  bool local_1a;
  undefined1 local_19;
  bool rv;
  Lexer *pLStack_18;
  bool firstComplete_local;
  Lexer *this_local;
  
  local_1a = true;
  local_19 = firstComplete;
  pLStack_18 = this;
  if (firstComplete) {
    do {
      iVar1 = currentChar(this);
      bVar3 = false;
      if (iVar1 == 0x3a) {
        iVar1 = peekChar(this);
        bVar3 = iVar1 != 0x3a;
      }
      if (!bVar3) {
        iVar1 = currentChar(this);
        if ((iVar1 == 0x3a) && (iVar1 = peekChar(this), iVar1 == 0x3a)) {
          std::__cxx11::string::operator+=((string *)&this->stringValue_,"::");
          nextChar(this,true);
          nextChar(this,true);
          bVar3 = isHexChar(this);
          if (bVar3) {
            local_62 = ipv6HexSeq(this);
          }
          else {
            local_62 = true;
          }
          local_1a = local_62;
        }
        goto LAB_0017816c;
      }
      std::__cxx11::string::operator+=((string *)&this->stringValue_,':');
      nextChar(this,true);
      bVar3 = ipv6HexDigit4(this);
    } while (bVar3);
    this->token_ = Unknown;
    this_local._4_4_ = Unknown;
  }
  else {
    sVar2 = std::__cxx11::string::size();
    this->ipv6HexDigits_ = sVar2;
    local_1a = ipv6HexPart(this);
LAB_0017816c:
    while( true ) {
      bVar3 = false;
      if (this->currentChar_ == 0x2e) {
        iVar1 = peekChar(this);
        iVar1 = isdigit(iVar1);
        bVar3 = iVar1 != 0;
      }
      if (!bVar3) break;
      std::__cxx11::string::operator+=((string *)&this->stringValue_,'.');
      nextChar(this,true);
      while (iVar1 = isdigit(this->currentChar_), iVar1 != 0) {
        std::__cxx11::string::operator+=((string *)&this->stringValue_,(char)this->currentChar_);
        nextChar(this,true);
      }
    }
    if ((local_1a & 1U) == 0) {
      this->token_ = Unknown;
      this_local._4_4_ = Unknown;
    }
    else {
      __s = (char *)std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,__s,&local_41);
      bVar3 = util::IPAddress::set(&this->ipValue_,&local_40,V6);
      std::__cxx11::string::~string((string *)&local_40);
      std::allocator<char>::~allocator(&local_41);
      if (((bVar3 ^ 0xffU) & 1) == 0) {
        if (this->currentChar_ == 0x2f) {
          this_local._4_4_ = continueCidr(this,0x80);
        }
        else {
          this->token_ = IP;
          this_local._4_4_ = IP;
        }
      }
      else {
        this->token_ = Unknown;
        this_local._4_4_ = Unknown;
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

Token Lexer::continueParseIPv6(bool firstComplete) {
  bool rv = true;
  if (firstComplete) {
    while (currentChar() == ':' && peekChar() != ':') {
      stringValue_ += ':';
      nextChar();

      if (!ipv6HexDigit4()) {
        return token_ = Token::Unknown;
      }
    }

    if (currentChar() == ':' && peekChar() == ':') {
      stringValue_ += "::";
      nextChar();
      nextChar();
      rv = isHexChar() ? ipv6HexSeq() : true;
    }
  } else {
    ipv6HexDigits_ = stringValue_.size();
    rv = ipv6HexPart();
  }

  // parse embedded IPv4 remainer
  while (currentChar_ == '.' && std::isdigit(peekChar())) {
    stringValue_ += '.';
    nextChar();

    while (std::isdigit(currentChar_)) {
      stringValue_ += static_cast<char>(currentChar_);
      nextChar();
    }
  }

  if (!rv)
    // Invalid IPv6
    return token_ = Token::Unknown;

  if (!ipValue_.set(stringValue_.c_str(), util::IPAddress::Family::V6))
    // Invalid IPv6
    return token_ = Token::Unknown;

  if (currentChar_ != '/') return token_ = Token::IP;

  return continueCidr(128);
}